

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  xmlXIncludeRefPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  xmlXIncludeRefPtr *ppxVar7;
  char *pcVar8;
  _xmlNode *p_Var9;
  int iVar10;
  long lVar11;
  _xmlNode *p_Var12;
  xmlNodePtr cur;
  char *extra;
  
  iVar1 = -1;
  if ((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) {
    iVar10 = ctxt->incNr;
    lVar11 = (long)iVar10;
    p_Var9 = tree;
    do {
      if (((p_Var9->type == XML_ELEMENT_NODE) && (p_Var9->ns != (xmlNs *)0x0)) &&
         ((iVar1 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
          iVar1 != 0 ||
          (iVar1 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
          iVar1 != 0)))) {
        iVar1 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude");
        if ((iVar1 != 0) && (ctxt->legacy == 0)) {
          ctxt->legacy = 1;
        }
        iVar1 = xmlStrEqual(p_Var9->name,(xmlChar *)"include");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(p_Var9->name,(xmlChar *)"fallback");
          if ((iVar1 != 0) &&
             ((((p_Var12 = p_Var9->parent, p_Var12 == (_xmlNode *)0x0 ||
                (p_Var12->type != XML_ELEMENT_NODE)) || (p_Var12->ns == (xmlNs *)0x0)) ||
              (((iVar1 = xmlStrEqual(p_Var12->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude")
                , iVar1 == 0 &&
                (iVar1 = xmlStrEqual(p_Var9->parent->ns->href,
                                     (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar1 == 0)) ||
               (iVar1 = xmlStrEqual(p_Var9->parent->name,(xmlChar *)"include"), iVar1 == 0)))))) {
            iVar1 = 0x650;
            pcVar8 = "%s is not the child of an \'include\'\n";
            extra = "fallback";
LAB_00194619:
            xmlXIncludeErr(ctxt,p_Var9,iVar1,pcVar8,(xmlChar *)extra);
          }
          goto LAB_0019461e;
        }
        p_Var12 = p_Var9->children;
        if (p_Var12 != (_xmlNode *)0x0) {
          iVar1 = 0;
          do {
            if (((p_Var12->type == XML_ELEMENT_NODE) && (p_Var12->ns != (xmlNs *)0x0)) &&
               ((iVar2 = xmlStrEqual(p_Var12->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude")
                , iVar2 != 0 ||
                (iVar2 = xmlStrEqual(p_Var12->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude")
                , iVar2 != 0)))) {
              iVar2 = xmlStrEqual(p_Var12->name,(xmlChar *)"include");
              if (iVar2 != 0) {
                iVar1 = 0x64e;
                pcVar8 = "%s has an \'include\' child\n";
                goto LAB_00194612;
              }
              iVar2 = xmlStrEqual(p_Var12->name,(xmlChar *)"fallback");
              iVar1 = (iVar1 + 1) - (uint)(iVar2 == 0);
            }
            p_Var12 = p_Var12->next;
          } while (p_Var12 != (_xmlNode *)0x0);
          if (1 < iVar1) {
            iVar1 = 0x64f;
            pcVar8 = "%s has multiple fallback children\n";
LAB_00194612:
            extra = "include";
            goto LAB_00194619;
          }
        }
        ctxt->incTotal = ctxt->incTotal + 1;
        pxVar4 = xmlXIncludeExpandNode(ctxt,p_Var9);
        if (pxVar4 != (xmlXIncludeRefPtr)0x0) {
          pxVar4->replace = 1;
        }
LAB_00194633:
        while ((pxVar5 = p_Var9, p_Var9 != tree &&
               (pxVar5 = p_Var9->next, p_Var9->next == (xmlNodePtr)0x0))) {
          p_Var9 = p_Var9->parent;
          if (p_Var9 == (_xmlNode *)0x0) goto LAB_00194660;
        }
      }
      else {
LAB_0019461e:
        if ((p_Var9->children == (xmlNodePtr)0x0) ||
           (pxVar5 = p_Var9->children, (p_Var9->type | XML_COMMENT_NODE) != XML_DOCUMENT_NODE))
        goto LAB_00194633;
      }
    } while ((pxVar5 != (xmlNodePtr)0x0) && (p_Var9 = pxVar5, pxVar5 != tree));
LAB_00194660:
    iVar2 = ctxt->incNr;
    iVar1 = 0;
    if (iVar10 < iVar2) {
      ppxVar7 = ctxt->incTab;
      iVar1 = 0;
      do {
        pxVar4 = ppxVar7[lVar11];
        pxVar5 = pxVar4->inc;
        if (pxVar4->replace == 0) {
          if (pxVar5 != (xmlNodePtr)0x0) {
            xmlFreeNodeList(pxVar5);
            ppxVar7 = ctxt->incTab;
            ppxVar7[lVar11]->inc = (xmlNodePtr)0x0;
          }
        }
        else {
          if ((((pxVar5 != (xmlNodePtr)0x0) || (pxVar4->emptyFb != 0)) &&
              (cur = pxVar4->elem, cur != (xmlNodePtr)0x0)) && (cur->type != XML_NAMESPACE_DECL)) {
            pxVar4->inc = (xmlNodePtr)0x0;
            pxVar4->emptyFb = 0;
            if ((cur->parent == (_xmlNode *)0x0) || (cur->parent->type == XML_ELEMENT_NODE)) {
LAB_00194706:
              if ((ctxt->parseFlags & 0x8000) == 0) {
LAB_00194715:
                if (pxVar4->fallback != 0) {
                  xmlUnsetProp(cur,"href");
                }
                cur->type = XML_XINCLUDE_START;
                pxVar6 = cur->children;
                while (pxVar6 != (xmlNodePtr)0x0) {
                  p_Var9 = pxVar6->next;
                  xmlUnlinkNode(pxVar6);
                  xmlFreeNode(pxVar6);
                  pxVar6 = p_Var9;
                }
                pxVar6 = xmlNewDocNode(cur->doc,cur->ns,cur->name,(xmlChar *)0x0);
                if (pxVar6 == (xmlNodePtr)0x0) {
                  cur = pxVar4->elem;
                  iVar10 = 0x649;
                  pcVar8 = "failed to build node\n";
                  goto LAB_00194840;
                }
                pxVar6->type = XML_XINCLUDE_END;
                xmlAddNextSibling(cur,pxVar6);
                while (pxVar5 != (xmlNodePtr)0x0) {
                  p_Var9 = pxVar5->next;
                  xmlAddPrevSibling(pxVar6,pxVar5);
                  pxVar5 = p_Var9;
                }
              }
              else {
                while (pxVar5 != (xmlNodePtr)0x0) {
                  p_Var9 = pxVar5->next;
                  xmlAddPrevSibling(cur,pxVar5);
                  pxVar5 = p_Var9;
                }
LAB_001947f1:
                xmlUnlinkNode(cur);
                xmlFreeNode(cur);
              }
            }
            else {
              if (pxVar5 == (xmlNodePtr)0x0) {
                if ((ctxt->parseFlags & 0x8000) != 0) goto LAB_001947f1;
                goto LAB_00194715;
              }
              uVar3 = 0;
              p_Var9 = pxVar5;
              do {
                uVar3 = uVar3 + (p_Var9->type == XML_ELEMENT_NODE);
                p_Var9 = p_Var9->next;
              } while (p_Var9 != (_xmlNode *)0x0);
              if (uVar3 < 2) goto LAB_00194706;
              iVar10 = 0x64b;
              pcVar8 = "XInclude error: would result in multiple root nodes\n";
LAB_00194840:
              xmlXIncludeErr(ctxt,cur,iVar10,pcVar8,(xmlChar *)0x0);
              xmlFreeNodeList(pxVar5);
            }
          }
          ppxVar7 = ctxt->incTab;
          ppxVar7[lVar11]->replace = 0;
        }
        iVar1 = iVar1 + 1;
        lVar11 = lVar11 + 1;
        iVar2 = ctxt->incNr;
      } while (lVar11 < iVar2);
    }
    if (ctxt->isStream != 0) {
      if (0 < iVar2) {
        lVar11 = 0;
        do {
          xmlXIncludeFreeRef(ctxt->incTab[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar11 < ctxt->incNr);
      }
      ctxt->incNr = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return(-1);
    if (ctxt == NULL)
	return(-1);

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
            /*
             * Avoid superlinear expansion by limiting the total number
             * of replacements.
             */
            if (ctxt->incTotal >= 20)
                break;
#endif
            ctxt->incTotal++;
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            if ((ctxt->incTab[i]->inc != NULL) ||
                (ctxt->incTab[i]->emptyFb != 0)) {	/* (empty fallback) */
                xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            }
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}